

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O1

void * probe_contiguous(CPUPPCState_conflict2 *env,target_ulong addr,uint32_t nb,
                       MMUAccessType access_type,int mmu_idx,uintptr_t raddr)

{
  bool bVar1;
  void *pvVar2;
  void *pvVar3;
  void *pvVar4;
  uint uVar5;
  ulong addr_00;
  ulong uVar6;
  uint size;
  
  uVar5 = (uint)addr | 0xfffff000;
  size = -uVar5;
  if (nb <= size) {
    pvVar2 = probe_access_ppc64(env,addr,nb,access_type,mmu_idx,raddr);
    return pvVar2;
  }
  pvVar2 = probe_access_ppc64(env,addr,size,access_type,mmu_idx,raddr);
  bVar1 = (int)env->msr < 0;
  if (env->mmu_model != POWERPC_MMU_BOOKE206) {
    bVar1 = (long)env->msr < 0;
  }
  uVar6 = addr + size;
  addr_00 = uVar6 & 0xffffffff;
  if (bVar1) {
    addr_00 = uVar6;
  }
  pvVar3 = probe_access_ppc64(env,addr_00,uVar5 + nb,access_type,mmu_idx,raddr);
  pvVar4 = (void *)0x0;
  if (pvVar3 == (void *)((ulong)size + (long)pvVar2)) {
    pvVar4 = pvVar2;
  }
  return pvVar4;
}

Assistant:

static void *probe_contiguous(CPUPPCState *env, target_ulong addr, uint32_t nb,
                              MMUAccessType access_type, int mmu_idx,
                              uintptr_t raddr)
{
    char *host1, *host2;
    uint32_t nb_pg1, nb_pg2;

#ifdef _MSC_VER
    nb_pg1 = 0 - (addr | TARGET_PAGE_MASK);
#else
    nb_pg1 = -(addr | TARGET_PAGE_MASK);
#endif
    if (likely(nb <= nb_pg1)) {
        /* The entire operation is on a single page.  */
        return probe_access(env, addr, nb, access_type, mmu_idx, raddr);
    }

    /* The operation spans two pages.  */
    nb_pg2 = nb - nb_pg1;
    host1 = probe_access(env, addr, nb_pg1, access_type, mmu_idx, raddr);
    addr = addr_add(env, addr, nb_pg1);
    host2 = probe_access(env, addr, nb_pg2, access_type, mmu_idx, raddr);

    /* If the two host pages are contiguous, optimize.  */
    if (host2 == host1 + nb_pg1) {
        return host1;
    }
    return NULL;
}